

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init_gau.c
# Opt level: O2

int init_gau(lexicon_t *lex,model_def_t *mdef,feat_t *feat)

{
  uint uVar1;
  int32 n_frame_00;
  feat_t *fcb;
  uint16 *seg_00;
  vector_t ***p;
  int iVar2;
  uint uVar3;
  cmd_ln_t *pcVar4;
  long lVar5;
  char *pcVar6;
  char **ppcVar7;
  acmod_id_t *phone;
  uint32 *ci_sseq;
  mfcc_t ***feat_00;
  size_t sVar8;
  char *pcVar9;
  uint32 uVar10;
  ulong uVar11;
  acmod_set_t *paVar12;
  model_def_t *mdef_00;
  int32 n_frame;
  vector_t *mfcc;
  uint32 *local_e8;
  feat_t *local_e0;
  uint32 *local_d8;
  uint32 n_phone;
  uint16 *seg;
  char *trans;
  vector_t ****local_b8;
  float32 ***local_b0;
  char *btw_mark;
  vector_t ***local_a0;
  uint local_94;
  int32 tmp;
  int32 feat_n_frame;
  vector_t ***local_88;
  char **local_80;
  vector_t ***mean;
  model_def_t *local_70;
  long local_68;
  long local_60;
  acmod_set_t *local_58;
  lexicon_t *local_50;
  uint32 *r_veclen;
  uint32 r_n_density;
  uint32 r_n_feat;
  uint32 r_n_ts;
  
  trans = (char *)0x0;
  mfcc = (vector_t *)0x0;
  seg = (uint16 *)0x0;
  btw_mark = (char *)0x0;
  mean = (vector_t ***)0x0;
  local_50 = lex;
  pcVar4 = cmd_ln_get();
  local_60 = cmd_ln_int_r(pcVar4,"-ceplen");
  pcVar4 = cmd_ln_get();
  lVar5 = cmd_ln_int_r(pcVar4,"-fullvar");
  if (mdef == (model_def_t *)0x0) {
    uVar3 = 1;
    paVar12 = (acmod_set_t *)0x0;
  }
  else {
    paVar12 = mdef->acmod_set;
    uVar3 = mdef->n_tied_state;
  }
  pcVar4 = cmd_ln_get();
  pcVar6 = cmd_ln_str_r(pcVar4,"-meanfn");
  if (feat->lda == (mfcc_t ***)0x0) {
    local_e8 = feat->sv_len;
    if (local_e8 == (uint32 *)0x0) {
      local_e8 = feat->stream_len;
    }
  }
  else {
    local_e8 = &feat->out_dim;
  }
  uVar1 = feat->n_sv;
  uVar11 = (ulong)uVar1;
  if (pcVar6 == (char *)0x0) {
    if (uVar1 == 0) {
      uVar11 = (ulong)(uint)feat->n_stream;
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/init_gau.c"
            ,0x86,"Computing %ux%ux1 mean estimates\n",(ulong)uVar3,uVar11);
    uVar10 = feat->n_sv;
    if (uVar10 == 0) {
      uVar10 = feat->n_stream;
    }
    local_a0 = gauden_alloc_param(uVar3,uVar10,1,local_e8);
    local_88 = (vector_t ***)0x0;
  }
  else {
    if (uVar1 == 0) {
      uVar11 = (ulong)(uint)feat->n_stream;
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/init_gau.c"
            ,0x91,"Computing %ux%ux1 variance estimates\n",(ulong)uVar3,uVar11);
    iVar2 = s3gau_read(pcVar6,&mean,&r_n_ts,&r_n_feat,&r_n_density,&r_veclen);
    if (iVar2 != 0) {
      err_msg_system(ERR_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/init_gau.c"
                     ,0x9a,"Unable to open %s for reading\n",pcVar6);
LAB_00103325:
      exit(1);
    }
    ckd_free(r_veclen);
    uVar10 = feat->n_sv;
    if ((int)lVar5 != 0) {
      if (uVar10 == 0) {
        uVar10 = feat->n_stream;
      }
      local_b8 = gauden_alloc_param_full(uVar3,uVar10,1,local_e8);
      local_a0 = (vector_t ***)0x0;
      local_88 = (vector_t ***)0x0;
      goto LAB_00102c19;
    }
    if (uVar10 == 0) {
      uVar10 = feat->n_stream;
    }
    local_88 = gauden_alloc_param(uVar3,uVar10,1,local_e8);
    local_a0 = (vector_t ***)0x0;
  }
  local_b8 = (vector_t ****)0x0;
LAB_00102c19:
  iVar2 = feat->n_sv;
  if (iVar2 == 0) {
    iVar2 = feat->n_stream;
  }
  local_e0 = feat;
  local_94 = uVar3;
  local_70 = mdef;
  local_68 = lVar5;
  local_58 = paVar12;
  local_b0 = (float32 ***)
             __ckd_calloc_3d__((ulong)uVar3,(long)iVar2,1,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/init_gau.c"
                               ,0xab);
  uVar11 = 1;
  ppcVar7 = (char **)0x0;
  phone = (acmod_id_t *)0x0;
  feat_00 = (mfcc_t ***)0x0;
  ci_sseq = (uint32 *)0x0;
  local_d8 = (uint32 *)0x0;
  do {
    iVar2 = corpus_next_utt();
    if (iVar2 == 0) {
      pcVar4 = cmd_ln_get();
      pcVar6 = cmd_ln_str_r(pcVar4,"-accumdir");
      sVar8 = strlen(pcVar6);
      pcVar6 = (char *)__ckd_calloc__(sVar8 + 0xf,1,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/init_gau.c"
                                      ,0x128);
      pcVar4 = cmd_ln_get();
      pcVar9 = cmd_ln_str_r(pcVar4,"-accumdir");
      sprintf(pcVar6,"%s/gauden_counts",pcVar9);
      p = local_a0;
      uVar10 = local_e0->n_sv;
      if ((int)local_68 == 0) {
        if (uVar10 == 0) {
          uVar10 = local_e0->n_stream;
        }
        s3gaucnt_write(pcVar6,local_a0,local_88,1,local_b0,local_94,uVar10,1,local_e8);
      }
      else {
        if (uVar10 == 0) {
          uVar10 = local_e0->n_stream;
        }
        s3gaucnt_write_full(pcVar6,local_a0,local_b8,1,local_b0,local_94,uVar10,1,local_e8);
      }
      if (mfcc != (vector_t *)0x0) {
        free(*mfcc);
        ckd_free(mfcc);
        mfcc = (vector_t *)0x0;
      }
      if (trans != (char *)0x0) {
        free(trans);
        trans = (char *)0x0;
      }
      if (seg != (uint16 *)0x0) {
        free(seg);
        seg = (uint16 *)0x0;
      }
      if (ppcVar7 != (char **)0x0) {
        ckd_free(ppcVar7);
      }
      if (phone != (acmod_id_t *)0x0) {
        ckd_free(phone);
      }
      if (btw_mark != (char *)0x0) {
        ckd_free(btw_mark);
        btw_mark = (char *)0x0;
      }
      if (ci_sseq != (uint32 *)0x0) {
        ckd_free(ci_sseq);
      }
      if (local_d8 != (uint32 *)0x0) {
        ckd_free(local_d8);
      }
      if (feat_00 != (mfcc_t ***)0x0) {
        feat_array_free(feat_00);
      }
      if (p != (vector_t ***)0x0) {
        gauden_free_param(p);
      }
      if (local_88 != (vector_t ***)0x0) {
        gauden_free_param(local_88);
      }
      if (local_b8 != (vector_t ****)0x0) {
        gauden_free_param_full(local_b8);
      }
      ckd_free_3d(local_b0);
      ckd_free(pcVar6);
      return 0;
    }
    if (mfcc != (vector_t *)0x0) {
      free(*mfcc);
      ckd_free(mfcc);
      mfcc = (vector_t *)0x0;
    }
    if (trans != (char *)0x0) {
      free(trans);
      trans = (char *)0x0;
    }
    if (seg != (uint16 *)0x0) {
      free(seg);
      seg = (uint16 *)0x0;
    }
    if (ppcVar7 != (char **)0x0) {
      ckd_free(ppcVar7);
    }
    if (phone != (acmod_id_t *)0x0) {
      ckd_free(phone);
    }
    if (btw_mark != (char *)0x0) {
      ckd_free(btw_mark);
      btw_mark = (char *)0x0;
    }
    if (ci_sseq != (uint32 *)0x0) {
      ckd_free(ci_sseq);
    }
    if (local_d8 != (uint32 *)0x0) {
      ckd_free(local_d8);
    }
    if (feat_00 != (mfcc_t ***)0x0) {
      feat_array_free(feat_00);
    }
    if ((int)(uVar11 / 100) * -100 + 1 + (int)uVar11 == 1) {
      printf("[%u] ");
      fflush(_stdout);
    }
    if (local_70 != (model_def_t *)0x0) {
      iVar2 = corpus_get_sent(&trans);
      if (iVar2 == 0) {
        iVar2 = corpus_get_seg(&seg,&n_frame);
        if (iVar2 == 0) {
          uVar3 = str2words(trans,(char **)0x0,0);
          ppcVar7 = (char **)__ckd_calloc__((ulong)uVar3,8,
                                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/init_gau.c"
                                            ,0xe4);
          str2words(trans,ppcVar7,uVar3);
          local_80 = ppcVar7;
          phone = mk_phone_list(&btw_mark,&n_phone,ppcVar7,uVar3,local_50);
          seg_00 = seg;
          uVar10 = n_phone;
          n_frame_00 = n_frame;
          pcVar6 = corpus_utt();
          paVar12 = local_58;
          iVar2 = ck_seg(local_58,phone,uVar10,seg_00,n_frame_00,pcVar6);
          mdef_00 = local_70;
          if (iVar2 == 0) {
            ci_sseq = mk_sseq(seg,n_frame,phone,n_phone,local_70);
            iVar2 = cvt2triphone(paVar12,phone,btw_mark,n_phone);
            if (iVar2 == 0) {
              local_d8 = mk_sseq(seg,n_frame,phone,n_phone,mdef_00);
              ppcVar7 = local_80;
              goto LAB_00102e6f;
            }
          }
          else {
            ci_sseq = (uint32 *)0x0;
          }
          local_d8 = (uint32 *)0x0;
          feat_00 = (mfcc_t ***)0x0;
          ppcVar7 = local_80;
          goto LAB_001030a1;
        }
        pcVar6 = corpus_utt_brief_name();
        pcVar9 = "Unable to read Viterbi state segmentation for %s\n";
        lVar5 = 0xe0;
      }
      else {
        pcVar6 = corpus_utt_brief_name();
        pcVar9 = "Unable to read word transcript for %s\n";
        lVar5 = 0xdb;
      }
LAB_001032fc:
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/init_gau.c"
              ,lVar5,pcVar9,pcVar6);
      goto LAB_00103325;
    }
    ppcVar7 = (char **)0x0;
    phone = (acmod_id_t *)0x0;
    ci_sseq = (uint32 *)0x0;
    local_d8 = (uint32 *)0x0;
    mdef_00 = local_70;
LAB_00102e6f:
    iVar2 = corpus_get_generic_featurevec(&mfcc,&tmp,(uint32)local_60);
    fcb = local_e0;
    if (iVar2 < 0) {
      pcVar6 = "Can\'t read input features\n";
      lVar5 = 0xfc;
LAB_0010331e:
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/init_gau.c"
              ,lVar5,pcVar6);
      goto LAB_00103325;
    }
    if (mdef_00 == (model_def_t *)0x0) {
      n_frame = tmp;
    }
    else if (tmp != n_frame) {
      pcVar6 = corpus_utt_brief_name();
      pcVar9 = "# frames in MFCC file inconsistent w/ seg file for utt %s.\n";
      lVar5 = 0x103;
      goto LAB_001032fc;
    }
    feat_n_frame = tmp;
    if (tmp < 9) {
      pcVar6 = corpus_utt();
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/init_gau.c"
              ,0x10a,"utt %s too short\n",pcVar6);
      if (mfcc != (vector_t *)0x0) {
        ckd_free(*mfcc);
        ckd_free(mfcc);
        mfcc = (vector_t *)0x0;
      }
      feat_00 = (mfcc_t ***)0x0;
    }
    else {
      feat_00 = feat_array_alloc(local_e0,tmp + local_e0->window_size);
      feat_s2mfc2feat_live(fcb,(mfcc_t **)mfcc,&feat_n_frame,1,1,feat_00);
      if (feat_n_frame != n_frame) {
        pcVar6 = "# frames compute != # frames of state seg\n";
        lVar5 = 0x117;
        goto LAB_0010331e;
      }
      if (local_a0 == (vector_t ***)0x0) {
        if (local_88 == (vector_t ***)0x0) {
          if (local_b8 != (vector_t ****)0x0) {
            uVar10 = local_e0->n_sv;
            if (uVar10 == 0) {
              uVar10 = local_e0->n_stream;
            }
            accum_state_fullvar(local_b8,mean,local_b0,(vector_t **)feat_00,uVar10,local_e8,local_d8
                                ,ci_sseq,feat_n_frame);
          }
        }
        else {
          uVar10 = local_e0->n_sv;
          if (uVar10 == 0) {
            uVar10 = local_e0->n_stream;
          }
          accum_state_var(local_88,mean,local_b0,(vector_t **)feat_00,uVar10,local_e8,local_d8,
                          ci_sseq,feat_n_frame);
        }
      }
      else {
        uVar10 = local_e0->n_sv;
        if (uVar10 == 0) {
          uVar10 = local_e0->n_stream;
        }
        accum_state_mean(local_a0,local_b0,(vector_t **)feat_00,uVar10,local_e8,local_d8,ci_sseq,
                         feat_n_frame);
      }
    }
LAB_001030a1:
    uVar11 = (ulong)((int)uVar11 + 1);
  } while( true );
}

Assistant:

int
init_gau(lexicon_t *lex,
	 model_def_t *mdef,
	 feat_t *feat)
{
    char *trans = NULL;
    char *fn;
    acmod_set_t *acmod_set;

    vector_t *mfcc = NULL;
    int32 n_frame;
    int32 feat_n_frame;
    int32 tmp;
    
    uint16 *seg = NULL;
    uint32 *sseq = NULL;
    uint32 *ci_sseq = NULL;

    uint32 tick_cnt = 0;

    char **word = NULL;
    uint32 n_word;

    acmod_id_t *phone = NULL;
    uint32 n_phone;
    char *btw_mark = NULL;

    vector_t ***mean_acc = NULL;
    vector_t ***mean = NULL;
    vector_t ***var_acc = NULL;
    vector_t ****fullvar_acc = NULL;
    float32 ***dnom = NULL;

    const uint32 *veclen;

    uint32 n_ts;

    uint32 *r_veclen;
    uint32 r_n_ts;
    uint32 r_n_feat;
    uint32 r_n_density;

    mfcc_t ***f = NULL;

    const char *meanfn;

    uint32 ceplen = cmd_ln_int32("-ceplen");
    int32 var_is_full = cmd_ln_int32("-fullvar");

    if (mdef) {
	acmod_set = mdef->acmod_set;
	n_ts = mdef->n_tied_state;
    }
    else {
	acmod_set = NULL;
	n_ts = 1;		/* Global mean/var */
    }

    meanfn = cmd_ln_str("-meanfn");

    veclen = (uint32 *)feat_stream_lengths(feat);
    
    if (meanfn == NULL) {
	E_INFO("Computing %ux%ux1 mean estimates\n", n_ts, feat_dimension1(feat));
    
	mean_acc = gauden_alloc_param(n_ts,
				      feat_dimension1(feat),
				      1,
				      veclen);
	var_acc = NULL;
    }
    else {
	assert(meanfn != NULL);

	E_INFO("Computing %ux%ux1 variance estimates\n", n_ts, feat_dimension1(feat));


	if (s3gau_read(meanfn,
		       &mean,
		       &r_n_ts,
		       &r_n_feat,
		       &r_n_density,
		       &r_veclen) != S3_SUCCESS) {
	    E_FATAL_SYSTEM("Unable to open %s for reading\n", meanfn);
	}
	ckd_free(r_veclen);

	mean_acc = NULL;
	if (var_is_full)
		fullvar_acc = gauden_alloc_param_full(n_ts,
						      feat_dimension1(feat),
						      1,
						      veclen);
	else
		var_acc =  gauden_alloc_param(n_ts,
					      feat_dimension1(feat),
					      1,
					      veclen);
    }

    dnom = (float32 ***)ckd_calloc_3d(n_ts, feat_dimension1(feat), 1, sizeof(float32));

    while (corpus_next_utt()) {
	if (mfcc) {
	    free(mfcc[0]);
	    ckd_free(mfcc);
	    mfcc = NULL;
	}
	if (trans) {
	    free(trans);
	    trans = NULL;
	}
	if (seg) {
	    free(seg);
	    seg = NULL;
	}
	if (word) {
	    ckd_free(word);
	    word = NULL;
	}
	if (phone) {
	    ckd_free(phone);
	    phone = NULL;
	}
	if (btw_mark) {
	    ckd_free(btw_mark);
	    btw_mark = NULL;
	}
	if (ci_sseq) {
	    ckd_free(ci_sseq);
	    ci_sseq = NULL;
	}
	if (sseq) {
	    ckd_free(sseq);
	    sseq = NULL;
	}
	if (f) {
	    feat_array_free(f);
	    f = NULL;
	}
	
	if ((++tick_cnt % 100) == 0) {
	    printf("[%u] ", tick_cnt);
	    fflush(stdout);
	}

	if (mdef) {
	    if (corpus_get_sent(&trans) != S3_SUCCESS) {
		E_FATAL("Unable to read word transcript for %s\n", corpus_utt_brief_name());
	    }

	    if (corpus_get_seg(&seg, &n_frame) != S3_SUCCESS) {
		E_FATAL("Unable to read Viterbi state segmentation for %s\n",
			corpus_utt_brief_name());
	    }
	    
    	    n_word = str2words(trans, NULL, 0);
    	    word = ckd_calloc(n_word, sizeof(char*));
	    str2words(trans, word, n_word);
	    phone = mk_phone_list(&btw_mark, &n_phone, word, n_word, lex);

	    /* check to see whether the word transcript and dictionary entries
	       agree with the state segmentation */
	    if (ck_seg(acmod_set, phone, n_phone, seg, n_frame, corpus_utt()) != S3_SUCCESS) {
		continue;
	    }

	    /* make a tied state id sequence from the state segmentation and the
	       phone list */
	    ci_sseq = mk_sseq(seg, n_frame, phone, n_phone, mdef);

	    if (cvt2triphone(acmod_set, phone, btw_mark, n_phone) != S3_SUCCESS) {
		continue;
	    }

	    /* make a tied state id sequence from the state segmentation and the
	       phone list */
	    sseq = mk_sseq(seg, n_frame, phone, n_phone, mdef);
	}

        if (corpus_get_generic_featurevec(&mfcc, &tmp, ceplen) < 0) {
	        E_FATAL("Can't read input features\n");
	}

	if (mdef == NULL) n_frame = tmp;

	if (tmp != n_frame) {
	    E_FATAL("# frames in MFCC file inconsistent w/ seg file for utt %s.\n",
		    corpus_utt_brief_name());
	}

	feat_n_frame = n_frame;

	/* FIXME: This number is bogus, it ought to depend on the type of feature used. */
	if (n_frame < 9) {
	    E_WARN("utt %s too short\n", corpus_utt());
	    if (mfcc) {
		ckd_free(mfcc[0]);
		ckd_free(mfcc);
		mfcc = NULL;
	    }
	    continue;
	}
	
	f = feat_array_alloc(feat, feat_n_frame + feat_window_size(feat));
	feat_s2mfc2feat_live(feat, mfcc, &feat_n_frame, TRUE, TRUE, f);

	if (feat_n_frame != n_frame) {
	    E_FATAL("# frames compute != # frames of state seg\n");
	}

	if (mean_acc) {
	    /* accumulate mean sums since no estimate given */
	    accum_state_mean(mean_acc, dnom, f, feat_dimension1(feat), veclen, sseq, ci_sseq, n_frame);
	}
	else if (var_acc) {
	    /* accumulate var sums since mean estimate exists */
	    accum_state_var(var_acc, mean, dnom, f, feat_dimension1(feat), veclen, sseq, ci_sseq, n_frame);
	}
	else if (fullvar_acc) {
	    /* accumulate var sums since mean estimate exists */
	    accum_state_fullvar(fullvar_acc, mean, dnom, f, feat_dimension1(feat), veclen, sseq, ci_sseq, n_frame);
	}
    }
    
    fn = ckd_calloc(strlen(cmd_ln_str("-accumdir")) + strlen("/gauden_counts") + 1, 1);
    sprintf(fn, "%s/gauden_counts", cmd_ln_str("-accumdir"));
    
    if (var_is_full) {
	if (s3gaucnt_write_full(fn, mean_acc, fullvar_acc, TRUE /* 2-pass variance */, dnom,
				n_ts, feat_dimension1(feat), 1, veclen) != 0) {
	}
    }
    else {
	if (s3gaucnt_write(fn, mean_acc, var_acc, TRUE /* 2-pass variance */, dnom,
			   n_ts, feat_dimension1(feat), 1, veclen) != 0) {
	}
    }

    /* free the per utterance data structures from the last utt */
    if (mfcc) {
	free(mfcc[0]);
	ckd_free(mfcc);
	mfcc = NULL;
    }
    if (trans) {
	free(trans);
	trans = NULL;
    }
    if (seg) {
	free(seg);
	seg = NULL;
    }
    if (word) {
	ckd_free(word);
	word = NULL;
    }
    if (phone) {
	ckd_free(phone);
	phone = NULL;
    }
    if (btw_mark) {
	ckd_free(btw_mark);
	btw_mark = NULL;
    }
    if (ci_sseq) {
	ckd_free(ci_sseq);
	ci_sseq = NULL;
    }
    if (sseq) {
	ckd_free(sseq);
	sseq = NULL;
    }
    if (f) {
	feat_array_free(f);
	f = NULL;
    }

    if (mean_acc) {
	gauden_free_param(mean_acc);
    }
    if (var_acc) {
	gauden_free_param(var_acc);
    }
    if (fullvar_acc) {
	gauden_free_param_full(fullvar_acc);
    }
    ckd_free_3d((void ***)dnom);
    ckd_free(fn);

    return S3_SUCCESS;
}